

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializePartialToArray(MessageLite *this,void *data,int size)

{
  int size_00;
  undefined4 extraout_var;
  LogMessage *pLVar1;
  string_view v;
  uint8_t *start;
  LogMessage local_48;
  Voidify local_31;
  ulong local_30;
  size_t byte_size;
  uint8_t *puStack_20;
  int size_local;
  void *data_local;
  MessageLite *this_local;
  
  byte_size._4_4_ = size;
  puStack_20 = (uint8_t *)data;
  data_local = this;
  size_00 = (*this->_vptr_MessageLite[3])();
  local_30 = CONCAT44(extraout_var,size_00);
  if (local_30 < 0x80000000) {
    if ((long)byte_size._4_4_ < (long)local_30) {
      this_local._7_1_ = false;
    }
    else {
      SerializeToArrayImpl(this,puStack_20,size_00);
      this_local._7_1_ = true;
    }
  }
  else {
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
               ,0x270);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    v = GetTypeName(this);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,v);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [41])" exceeded maximum protobuf size of 2GB: ");
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar1);
    absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_48);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageLite::SerializePartialToArray(void* data, int size) const {
  const size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    ABSL_LOG(ERROR) << GetTypeName()
                    << " exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }
  if (size < static_cast<int64_t>(byte_size)) return false;
  uint8_t* start = reinterpret_cast<uint8_t*>(data);
  SerializeToArrayImpl(*this, start, byte_size);
  return true;
}